

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O2

bool __thiscall crnlib::data_stream::read_array(data_stream *this,vector<unsigned_char> *buf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar4;
  
  uVar1 = buf->m_size;
  iVar2 = (*this->_vptr_data_stream[10])();
  if ((ulong)uVar1 < CONCAT44(extraout_var,iVar2)) {
    iVar2 = (*this->_vptr_data_stream[10])(this);
    if (0x40000000 < CONCAT44(extraout_var_00,iVar2)) {
      return false;
    }
    uVar3 = (*this->_vptr_data_stream[10])(this);
    vector<unsigned_char>::resize(buf,uVar3,false);
  }
  iVar2 = (*this->_vptr_data_stream[10])(this);
  if (CONCAT44(extraout_var_01,iVar2) == 0) {
    vector<unsigned_char>::resize(buf,0,false);
    bVar4 = true;
  }
  else {
    uVar3 = (*this->_vptr_data_stream[4])(this,buf->m_p,(ulong)buf->m_size);
    bVar4 = uVar3 == buf->m_size;
  }
  return bVar4;
}

Assistant:

bool data_stream::read_array(vector<uint8>& buf)
    {
        if (buf.size() < get_remaining())
        {
            if (get_remaining() > 1024U * 1024U * 1024U)
            {
                return false;
            }

            buf.resize((uint)get_remaining());
        }

        if (!get_remaining())
        {
            buf.resize(0);
            return true;
        }

        return read(&buf[0], buf.size()) == buf.size();
    }